

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  uint uVar1;
  TRef TVar2;
  TRef *pTVar3;
  TRef TVar4;
  uint *puVar5;
  uint *puVar6;
  TRef *base;
  TRef *xbase;
  TRef *trp;
  TRef hdr;
  TRef tr;
  RecordIndex ix;
  undefined1 local_168 [4];
  BCReg s;
  TValue savetv [6];
  uint *local_130;
  TRef *top;
  BCReg topslot_local;
  BCReg baseslot_local;
  jit_State *J_local;
  
  local_130 = J->base + topslot;
  for (ix.idxchain = baseslot; (uint)ix.idxchain <= topslot; ix.idxchain = ix.idxchain + 1) {
    if (J->base[(uint)ix.idxchain] == 0) {
      sload(J,ix.idxchain);
    }
  }
  if ((((*local_130 >> 0x18 & 0x1f) - 0xe < 6) || ((*local_130 & 0x1f000000) == 0x4000000)) &&
     (((local_130[-1] >> 0x18 & 0x1f) - 0xe < 6 || ((local_130[-1] & 0x1f000000) == 0x4000000)))) {
    pTVar3 = J->base;
    for (xbase = local_130; pTVar3 + baseslot <= xbase; xbase = xbase + -1) {
      if ((*xbase >> 0x18 & 0x1f) - 0xe < 6) {
        TVar4 = *xbase;
        uVar1 = *xbase;
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar1 & 0x1f000000) == 0xe000000);
        TVar4 = lj_opt_fold(J);
        *xbase = TVar4;
      }
      else if ((*xbase & 0x1f000000) != 0x4000000) break;
    }
    puVar5 = xbase + 1;
    TVar4 = lj_ir_kptr_(J,IR_KPTR,&J[-1].penalty[0x2f].val);
    (J->fold).ins.field_0.ot = 0x5509;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = 0;
    TVar4 = lj_opt_fold(J);
    xbase = puVar5;
    trp._4_4_ = TVar4;
    do {
      puVar6 = xbase + 1;
      TVar2 = *xbase;
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)trp._4_4_;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      trp._4_4_ = lj_opt_fold(J);
      xbase = puVar6;
    } while (puVar6 <= local_130);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)trp._4_4_;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    TVar4 = lj_opt_fold(J);
    J->maxslot = (BCReg)((long)puVar5 - (long)J->base >> 2);
    if (puVar5 == pTVar3 + baseslot) {
      return TVar4;
    }
    top._0_4_ = J->maxslot;
    J->maxslot = (BCReg)top - 1;
    *puVar5 = TVar4;
    ix.tabv.u64 = (ulong)&J[-1].penalty[0x2a].val | 0xfffd800000000000;
    local_130 = puVar5;
  }
  else {
    J->maxslot = topslot - 1;
    ix.tabv = J->L->base[topslot];
    top._0_4_ = topslot;
  }
  _hdr = J->L->base[(BCReg)top - 1];
  ix.oldv._0_4_ = local_130[-1];
  ix.oldv._4_4_ = *local_130;
  memcpy(local_168,J->L->base + ((BCReg)top - 1),0x30);
  rec_mm_arith(J,(RecordIndex *)&hdr,MM_concat);
  memcpy(J->L->base + ((BCReg)top - 1),local_168,0x30);
  return 0;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  TRef *top = &J->base[topslot];
  TValue savetv[5+LJ_FR2];
  BCReg s;
  RecordIndex ix;
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) return tr;  /* Return simple concatenation result. */
    /* Pass partial result. */
    topslot = J->maxslot--;
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  memcpy(savetv, &J->L->base[topslot-1], sizeof(savetv));  /* Save slots. */
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  memcpy(&J->L->base[topslot-1], savetv, sizeof(savetv));  /* Restore slots. */
  return 0;  /* No result yet. */
}